

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.hpp
# Opt level: O1

void baryonyx::details::fail_fast(char *type,char *cond,char *file,char *line)

{
  print(type,cond,file,line);
  std::terminate();
}

Assistant:

[[noreturn]] inline auto
fail_fast(const char* type,
          const char* cond,
          const char* file,
          const char* line) -> void
{
    print(type, cond, file, line);

#ifndef BARYONYX_FAIL_FAST
    std::terminate();
#else
    throw std::logic_error(cond);
#endif
}